

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangle.cpp
# Opt level: O3

Vector3D * CGL::SceneObjects::moller_trumbore(Vector3D *p0,Vector3D *p1,Vector3D *p2,Ray *r)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined1 auVar9 [16];
  Vector3D *t_b1_b2;
  Vector3D *in_RDI;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  auVar13 = *(undefined1 (*) [16])(p0->field_0).field_2.__vec;
  auVar5 = vsubpd_avx(*(undefined1 (*) [16])(p1->field_0).field_2.__vec,auVar13);
  dVar1 = (p0->field_0).field_0.z;
  dVar10 = (p1->field_0).field_0.z - dVar1;
  auVar6 = vsubpd_avx(*(undefined1 (*) [16])(p2->field_0).field_2.__vec,auVar13);
  dVar8 = (p2->field_0).field_0.z - dVar1;
  auVar7 = vsubpd_avx(*(undefined1 (*) [16])(r->o).field_0.field_2.__vec,auVar13);
  dVar1 = (r->o).field_0.field_0.z - dVar1;
  dVar2 = (r->d).field_0.field_0.y;
  dVar3 = (r->d).field_0.field_0.z;
  auVar13 = vshufpd_avx(auVar6,auVar6,1);
  dVar4 = (r->d).field_0.field_0.x;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = dVar2 * dVar8 - auVar13._0_8_ * dVar3;
  auVar12._8_8_ = 0;
  auVar12._0_8_ = dVar3 * auVar6._0_8_ - dVar4 * dVar8;
  auVar9 = vunpcklpd_avx(auVar11,auVar12);
  dVar2 = dVar4 * auVar13._0_8_ - auVar6._0_8_ * dVar2;
  auVar11 = vshufpd_avx(auVar7,auVar7,1);
  auVar12 = vshufpd_avx(auVar5,auVar5,1);
  auVar13._8_8_ = 0;
  auVar13._0_8_ = auVar11._0_8_ * dVar10 - auVar12._0_8_ * dVar1;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar1 * auVar5._0_8_ - dVar10 * auVar7._0_8_;
  auVar14 = vunpcklpd_avx(auVar13,auVar14);
  auVar13 = vdppd_avx(auVar14,auVar6,0x31);
  dVar4 = auVar12._0_8_ * auVar7._0_8_ - auVar11._0_8_ * auVar5._0_8_;
  auVar11 = vdppd_avx(auVar9,auVar7,0x31);
  auVar12 = vdppd_avx(auVar14,*(undefined1 (*) [16])(r->d).field_0.field_2.__vec,0x31);
  auVar5 = vdppd_avx(auVar9,auVar5,0x31);
  dVar10 = 1.0 / (dVar2 * dVar10 + auVar5._0_8_);
  (in_RDI->field_0).field_0.x = (dVar4 * dVar8 + auVar13._0_8_) * dVar10;
  (in_RDI->field_0).field_0.y = (dVar2 * dVar1 + auVar11._0_8_) * dVar10;
  (in_RDI->field_0).field_0.z = (dVar4 * dVar3 + auVar12._0_8_) * dVar10;
  return in_RDI;
}

Assistant:

Vector3D moller_trumbore(const Vector3D &p0, const Vector3D &p1, const Vector3D &p2, const Ray &r) {
    Vector3D e1, e2, s, s1, s2;

    e1 = p1 - p0;
    e2 = p2 - p0;
    s = r.o - p0;

    s1 = cross(r.d, e2);
    s2 = cross(s, e1);

    Vector3D t_b1_b2 = Vector3D();
    t_b1_b2.x = dot(s2,  e2);
    t_b1_b2.y = dot(s1,   s);
    t_b1_b2.z = dot(s2, r.d);

    t_b1_b2 /= dot(s1, e1);

    return t_b1_b2;
}